

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O2

bool __thiscall
llvm::cl::
OptionValueCopy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
compare(OptionValueCopy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *V)

{
  bool bVar1;
  
  if (this->Valid == true) {
    bVar1 = std::operator!=(&this->Value,V);
    return bVar1;
  }
  return false;
}

Assistant:

bool compare(const DataType &V) const { return Valid && (Value != V); }